

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoadStoreChecks.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_178c6::InstrumentMemoryAccesses::runOnFunction
          (InstrumentMemoryAccesses *this,Function *F)

{
  CallBase *this_00;
  Type *DestTy;
  IntegerType *pIVar1;
  uint __line;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
  tmp;
  Function *pFVar2;
  DataLayout *pDVar3;
  CallBase *pCVar4;
  Value *pVVar5;
  MemTransferBase<llvm::MemIntrinsic> *this_01;
  Value *pVVar6;
  ulong uVar7;
  Statistic *this_02;
  char *__assertion;
  Function *pFVar8;
  Function *pFVar9;
  StringRef SVar10;
  StringRef SVar11;
  TypeSize TVar12;
  Function *pFStack_110;
  Child local_f8 [2];
  IRBuilder<llvm::ConstantFolder,_llvm::IRBuilderDefaultInserter> *local_d0;
  Function *local_c8;
  Function *local_c0;
  undefined1 local_b8 [128];
  code *local_38;
  
  SVar10.Length = (size_t)"__loadcheck";
  SVar10.Data = *(char **)(F + 0x28);
  pFVar2 = (Function *)llvm::Module::getFunction(SVar10);
  this->LoadCheckFunction = pFVar2;
  if (pFVar2 == (Function *)0x0) {
LAB_0010a747:
    __assertion = "LoadCheckFunction && \"__loadcheck function has disappeared!\\n\"";
    __line = 0x55;
  }
  else {
    SVar11.Length = (size_t)"__storecheck";
    SVar11.Data = *(char **)(F + 0x28);
    pFVar2 = (Function *)llvm::Module::getFunction(SVar11);
    this->StoreCheckFunction = pFVar2;
    if (pFVar2 != (Function *)0x0) {
      pDVar3 = (DataLayout *)llvm::Module::getDataLayout();
      this->TD = pDVar3;
      local_b8._64_8_ = llvm::Function::getContext();
      local_b8._72_8_ = local_b8 + 0x78;
      local_b8._80_8_ = &local_38;
      local_b8._0_8_ = local_b8 + 0x10;
      local_b8._8_4_ = 0;
      local_b8._12_4_ = 2;
      local_b8._88_8_ = (MDNode *)0x0;
      local_b8._96_4_ = 0;
      local_b8[100] = false;
      local_b8[0x65] = ebStrict;
      local_b8[0x66] = Dynamic;
      local_b8._48_8_ = (BasicBlock *)0x0;
      local_b8._56_8_ = (node_pointer)0x0;
      local_b8._104_8_ = (OperandBundleDefT<llvm::Value_*> *)0x0;
      local_b8._112_8_ = 0;
      local_b8._120_8_ = llvm::Module::getDataLayout;
      local_38 = llvm::Pass::getAsImmutablePass;
      this->Builder = (IRBuilder<llvm::ConstantFolder,_llvm::IRBuilderDefaultInserter> *)local_b8;
      local_c8 = F + 0x48;
      pFVar2 = *(Function **)(F + 0x50);
LAB_0010a447:
      if (pFVar2 == local_c8) {
        llvm::IRBuilder<llvm::ConstantFolder,_llvm::IRBuilderDefaultInserter>::~IRBuilder
                  ((IRBuilder<llvm::ConstantFolder,_llvm::IRBuilderDefaultInserter> *)local_b8);
        return true;
      }
      pFStack_110 = *(Function **)(pFVar2 + 8);
      pFVar9 = pFVar2 + -0x18;
      if (pFVar2 == (Function *)0x0) {
        pFVar9 = (Function *)0x0;
      }
      pFVar8 = *(Function **)(pFVar9 + 0x30);
      local_c0 = pFStack_110;
switchD_0010a4a0_caseD_1c:
      pFVar2 = local_c0;
      if (pFVar8 == pFVar9 + 0x28) goto LAB_0010a447;
      this_00 = (CallBase *)(pFVar8 + -0x18);
      pCVar4 = this_00;
      if (pFVar8 == (Function *)0x0) {
        pCVar4 = (CallBase *)0x0;
      }
      if (0x42 < (byte)pCVar4->field_0x10 - 0x1c) {
        llvm::llvm_unreachable_internal
                  ((llvm *)"Unknown instruction type encountered!",
                   "/usr/lib/llvm-14/include/llvm/IR/InstVisitor.h",(char *)0x79,(uint)pFStack_110);
        goto LAB_0010a747;
      }
      pFVar8 = *(Function **)(pFVar8 + 8);
      switch((uint)(byte)pCVar4->field_0x10) {
      default:
        goto switchD_0010a4a0_caseD_1c;
      case 0x3b:
        pIVar1 = this->SizeTy;
        TVar12 = llvm::DataLayout::getTypeStoreSize(this->TD,*(Type **)this_00);
        local_f8[0]._0_8_ =
             TVar12.super_LinearPolySize<llvm::TypeSize>.
             super_UnivariateLinearPolyBase<llvm::TypeSize>.Value;
        local_f8[0]._8_4_ =
             TVar12.super_LinearPolySize<llvm::TypeSize>.
             super_UnivariateLinearPolyBase<llvm::TypeSize>.UnivariateDim;
        uVar7 = llvm::TypeSize::operator_cast_to_unsigned_long
                          ((TypeSize *)&local_f8[0].ptrAndLength);
        pVVar5 = (Value *)llvm::ConstantInt::get(pIVar1,uVar7,false);
        pVVar6 = llvm::LoadInst::getPointerOperand((LoadInst *)this_00);
        pFStack_110 = this->LoadCheckFunction;
        instrument(this,pVVar6,pVVar5,pFStack_110,(Instruction *)this_00);
        this_02 = &LoadsInstrumented;
        break;
      case 0x3c:
        pDVar3 = this->TD;
        pVVar5 = llvm::StoreInst::getValueOperand((StoreInst *)this_00);
        TVar12 = llvm::DataLayout::getTypeStoreSize(pDVar3,*(Type **)pVVar5);
        local_f8[0]._0_8_ =
             TVar12.super_LinearPolySize<llvm::TypeSize>.
             super_UnivariateLinearPolyBase<llvm::TypeSize>.Value;
        local_f8[0]._8_4_ =
             TVar12.super_LinearPolySize<llvm::TypeSize>.
             super_UnivariateLinearPolyBase<llvm::TypeSize>.UnivariateDim;
        uVar7 = llvm::TypeSize::operator_cast_to_unsigned_long
                          ((TypeSize *)&local_f8[0].ptrAndLength);
        pVVar5 = (Value *)llvm::ConstantInt::get(this->SizeTy,uVar7,false);
        pVVar6 = llvm::StoreInst::getPointerOperand((StoreInst *)this_00);
        pFStack_110 = this->StoreCheckFunction;
        instrument(this,pVVar6,pVVar5,pFStack_110,(Instruction *)this_00);
        this_02 = &StoresInstrumented;
        break;
      case 0x3f:
        pIVar1 = this->SizeTy;
        TVar12 = llvm::DataLayout::getTypeStoreSize(this->TD,*(Type **)this_00);
        local_f8[0]._0_8_ =
             TVar12.super_LinearPolySize<llvm::TypeSize>.
             super_UnivariateLinearPolyBase<llvm::TypeSize>.Value;
        local_f8[0]._8_4_ =
             TVar12.super_LinearPolySize<llvm::TypeSize>.
             super_UnivariateLinearPolyBase<llvm::TypeSize>.UnivariateDim;
        uVar7 = llvm::TypeSize::operator_cast_to_unsigned_long
                          ((TypeSize *)&local_f8[0].ptrAndLength);
        pVVar5 = (Value *)llvm::ConstantInt::get(pIVar1,uVar7,false);
        pVVar6 = llvm::AtomicCmpXchgInst::getPointerOperand((AtomicCmpXchgInst *)this_00);
        goto LAB_0010a66f;
      case 0x40:
        pIVar1 = this->SizeTy;
        TVar12 = llvm::DataLayout::getTypeStoreSize(this->TD,*(Type **)this_00);
        local_f8[0]._0_8_ =
             TVar12.super_LinearPolySize<llvm::TypeSize>.
             super_UnivariateLinearPolyBase<llvm::TypeSize>.Value;
        local_f8[0]._8_4_ =
             TVar12.super_LinearPolySize<llvm::TypeSize>.
             super_UnivariateLinearPolyBase<llvm::TypeSize>.UnivariateDim;
        uVar7 = llvm::TypeSize::operator_cast_to_unsigned_long
                          ((TypeSize *)&local_f8[0].ptrAndLength);
        pVVar5 = (Value *)llvm::ConstantInt::get(pIVar1,uVar7,false);
        pVVar6 = llvm::AtomicRMWInst::getPointerOperand((AtomicRMWInst *)this_00);
LAB_0010a66f:
        pFStack_110 = this->StoreCheckFunction;
        instrument(this,pVVar6,pVVar5,pFStack_110,(Instruction *)this_00);
        this_02 = &AtomicsInstrumented;
        break;
      case 0x53:
        pFVar2 = llvm::CallBase::getCalledFunction(this_00);
        if (pFVar2 == (Function *)0x0) goto switchD_0010a4a0_caseD_1c;
        pFStack_110 = (Function *)0xffffff41;
        if ((5 < *(int *)(pFVar2 + 0x24) - 0xbfU) ||
           (pFStack_110 = (Function *)0x29,
           (0x29U >> (*(int *)(pFVar2 + 0x24) - 0xbfU & 0x1f) & 1) == 0))
        goto switchD_0010a4a0_caseD_1c;
        llvm::IRBuilderBase::SetInsertPoint
                  (&this->Builder->super_IRBuilderBase,(Instruction *)this_00);
        local_d0 = this->Builder;
        pVVar5 = llvm::MemIntrinsicBase<llvm::MemIntrinsic>::getLength
                           ((MemIntrinsicBase<llvm::MemIntrinsic> *)this_00);
        DestTy = (Type *)this->SizeTy;
        llvm::Twine::Twine((Twine *)&local_f8[0].ptrAndLength,"");
        pVVar5 = llvm::IRBuilderBase::CreateIntCast
                           (&local_d0->super_IRBuilderBase,pVVar5,DestTy,false,
                            (Twine *)&local_f8[0].ptrAndLength);
        this_01 = &llvm::dyn_cast<llvm::MemTransferInst,llvm::MemIntrinsic>((MemIntrinsic *)this_00)
                   ->super_MemTransferBase<llvm::MemIntrinsic>;
        if (this_01 != (MemTransferBase<llvm::MemIntrinsic> *)0x0) {
          pVVar6 = llvm::MemTransferBase<llvm::MemIntrinsic>::getSource(this_01);
          instrument(this,pVVar6,pVVar5,this->LoadCheckFunction,(Instruction *)this_00);
        }
        pVVar6 = llvm::MemIntrinsicBase<llvm::MemIntrinsic>::getDest
                           ((MemIntrinsicBase<llvm::MemIntrinsic> *)this_00);
        pFStack_110 = this->StoreCheckFunction;
        instrument(this,pVVar6,pVVar5,pFStack_110,(Instruction *)this_00);
        this_02 = &IntrinsicsInstrumented;
      }
      llvm::TrackingStatistic::operator++(this_02);
      goto switchD_0010a4a0_caseD_1c;
    }
    __assertion = "StoreCheckFunction && \"__storecheck function has disappeared!\\n\"";
    __line = 0x58;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/ZanderChang[P]dataflow-pass/dataflow/LoadStoreChecks.cpp"
                ,__line,
                "virtual bool (anonymous namespace)::InstrumentMemoryAccesses::runOnFunction(Function &)"
               );
}

Assistant:

bool InstrumentMemoryAccesses::runOnFunction(Function &F) {
    // Check that the load and store check functions are declared.
    LoadCheckFunction = F.getParent()->getFunction("__loadcheck");
    assert(LoadCheckFunction && "__loadcheck function has disappeared!\n");

    StoreCheckFunction = F.getParent()->getFunction("__storecheck");
    assert(StoreCheckFunction && "__storecheck function has disappeared!\n");

    TD = &F.getParent()->getDataLayout();
    IRBuilder<> TheBuilder(F.getContext());
    Builder = &TheBuilder;

    // Visit all of the instructions in the function.
    visit(F);
    return true;
}